

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode_io.c
# Opt level: O3

int CVodeSetMaxNonlinIters(void *cvode_mem,int maxcor)

{
  int iVar1;
  int error_code;
  char *msgfmt;
  
  if (cvode_mem == (void *)0x0) {
    msgfmt = "cvode_mem = NULL illegal.";
    iVar1 = -0x15;
    error_code = -0x15;
  }
  else {
    if (*(SUNNonlinearSolver *)((long)cvode_mem + 0x3c8) != (SUNNonlinearSolver)0x0) {
      iVar1 = SUNNonlinSolSetMaxIters(*(SUNNonlinearSolver *)((long)cvode_mem + 0x3c8),maxcor);
      return iVar1;
    }
    msgfmt = "A memory request failed.";
    iVar1 = -0x14;
    error_code = -0x14;
  }
  cvProcessError((CVodeMem)0x0,error_code,"CVODE","CVodeSetMaxNonlinIters",msgfmt);
  return iVar1;
}

Assistant:

int CVodeSetMaxNonlinIters(void *cvode_mem, int maxcor)
{
  CVodeMem cv_mem;

  if (cvode_mem==NULL) {
    cvProcessError(NULL, CV_MEM_NULL, "CVODE", "CVodeSetMaxNonlinIters", MSGCV_NO_MEM);
    return (CV_MEM_NULL);
  }

  cv_mem = (CVodeMem) cvode_mem;

  if (cv_mem->NLS == NULL) {
    cvProcessError(NULL, CV_MEM_FAIL, "CVODE", "CVodeSetMaxNonlinIters", MSGCV_MEM_FAIL);
    return (CV_MEM_FAIL);
  }

  return(SUNNonlinSolSetMaxIters(cv_mem->NLS, maxcor));
}